

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void convolve(int *c1,int *c2,int param_3)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  float fVar14;
  float in_stack_000004f8;
  uint in_stack_000004fc;
  float in_stack_000009f0;
  uint in_stack_000009f4;
  
  uVar4 = 0;
  uVar12 = (ulong)in_stack_000009f4;
  if ((int)in_stack_000009f4 < 1) {
    uVar12 = uVar4;
  }
  lVar5 = (long)(param_3 - (int)in_stack_000009f4 / 2);
  lVar2 = (long)((int)in_stack_000009f4 / 2);
  for (lVar3 = lVar2; lVar3 < lVar5; lVar3 = lVar3 + 1) {
    iVar10 = 0;
    iVar1 = c1[2];
    if (c1[2] < 1) {
      iVar1 = iVar10;
    }
    for (; iVar10 != iVar1; iVar10 = iVar10 + 1) {
      iVar13 = 0;
      iVar6 = c1[1];
      if (c1[1] < 1) {
        iVar6 = iVar13;
      }
      for (; iVar13 != iVar6; iVar13 = iVar13 + 1) {
        fVar14 = 0.0;
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          fVar14 = fVar14 + *(float *)(*(long *)(c1 + (long)((int)uVar4 + (int)uVar11) * 2 + 6) +
                                      (long)(*c1 * iVar10 + iVar13) * 4) *
                            *(float *)(&stack0x00000500 + uVar11 * 4);
        }
        *(float *)(*(long *)(c2 + (lVar3 - lVar2) * 2 + 6) + (long)(*c2 * iVar10 + iVar13) * 4) =
             fVar14 / in_stack_000009f0;
      }
    }
    uVar4 = uVar4 + 1;
  }
  iVar1 = (int)in_stack_000004fc / 2;
  if ((int)in_stack_000004fc < 1) {
    in_stack_000004fc = 0;
  }
  for (lVar3 = lVar2; lVar3 < lVar5; lVar3 = lVar3 + 1) {
    __ptr = malloc(0x61840);
    iVar10 = c2[2];
    iVar6 = 0;
    iVar13 = 0;
    if (0 < iVar10) {
      iVar6 = iVar10;
      iVar13 = 0;
    }
    for (; iVar13 != iVar6; iVar13 = iVar13 + 1) {
      iVar7 = c2[1];
      iVar8 = 0;
      for (iVar9 = iVar1; iVar9 < iVar7 - iVar1; iVar9 = iVar9 + 1) {
        fVar14 = 0.0;
        for (uVar12 = 0; in_stack_000004fc != uVar12; uVar12 = uVar12 + 1) {
          fVar14 = fVar14 + *(float *)(*(long *)(c2 + (lVar3 - lVar2) * 2 + 6) +
                                      (long)((int)uVar12 + iVar8 + *c2 * iVar13) * 4) *
                            *(float *)(&stack0x00000008 + uVar12 * 4);
        }
        *(float *)((long)__ptr + (long)(*c2 * iVar13 + iVar9) * 4) = fVar14 / in_stack_000004f8;
        iVar8 = iVar8 + 1;
      }
    }
    iVar13 = 0;
    for (iVar6 = iVar1; iVar6 < iVar10 - iVar1; iVar6 = iVar6 + 1) {
      iVar9 = 0;
      iVar7 = c2[1];
      if (c2[1] < 1) {
        iVar7 = iVar9;
      }
      for (; iVar9 != iVar7; iVar9 = iVar9 + 1) {
        fVar14 = 0.0;
        for (uVar12 = 0; in_stack_000004fc != uVar12; uVar12 = uVar12 + 1) {
          fVar14 = fVar14 + *(float *)((long)__ptr +
                                      (long)((iVar13 + (int)uVar12) * *c2 + iVar9) * 4) *
                            *(float *)(&stack0x00000008 + uVar12 * 4);
        }
        *(float *)(*(long *)(c2 + (lVar3 - lVar2) * 2 + 6) + (long)(*c2 * iVar6 + iVar9) * 4) =
             fVar14 / in_stack_000004f8;
      }
      iVar13 = iVar13 + 1;
    }
    free(__ptr);
  }
  c2[4] = c2[4] + iVar1;
  return;
}

Assistant:

void convolve(c1,c2,ker1,ker2,n)
qnode_ptr_t c1, c2 ;
kernel_t ker1, ker2 ;
int n ;

{ image512_t *t ;
  float s ;
  int i, j, k, l, h1, h2 ;

  h2 = ker2.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {
    for (i = 0 ; i < c1->sizy ; i++) {
      for (j = 0 ; j < c1->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker2.m ; l++) {
          s += (*c1->gauss_ptr[l+k-h2])[c1->res*i + j]*ker2.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker2.f ;
      }
    }
  }

  h1 = ker1.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {

    t = (image512_t *)malloc(sizeof(image512_t)) ;

    for (i = 0 ; i < c2->sizy ; i++) {
      for (j = h1 ; j < c2->sizx - h1 ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*c2->gauss_ptr[k-h2])[c2->res*i + j+l-h1]*ker1.k[l] ;
        }
        (*t)[c2->res*i + j] = s/ker1.f ;
      }
    }

    for (i = h1 ; i < c2->sizy - h1 ; i++) {
      for (j = 0 ; j < c2->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*t)[c2->res*(i+l-h1) + j]*ker1.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker1.f ;
      }
    }
    free((image512_t *)t) ;
  }
  c2->ofst += h1 ;
}